

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

void __thiscall QMarkdownTextEdit::duplicateText(QMarkdownTextEdit *this)

{
  bool bVar1;
  int iVar2;
  MoveMode MVar3;
  MoveMode MVar4;
  int selectionEnd;
  int selectionStart;
  QString local_60;
  int local_44;
  int local_40;
  int positionDiff;
  int position;
  undefined1 local_30 [8];
  QString selectedText;
  QTextCursor cursor;
  QMarkdownTextEdit *this_local;
  
  QPlainTextEdit::textCursor();
  QTextCursor::selectedText();
  bVar1 = QString::isEmpty((QString *)local_30);
  if (bVar1) {
    local_40 = QTextCursor::position();
    QTextCursor::movePosition((int)&selectedText + NextBlock,4,0);
    QTextCursor::movePosition((int)&selectedText + NextBlock,0xf,1);
    local_44 = QTextCursor::position();
    local_44 = local_44 - local_40;
    QTextCursor::selectedText();
    operator+(&local_60,"\n",(QString *)&selectionEnd);
    QString::operator=((QString *)local_30,(QString *)&local_60);
    QString::~QString(&local_60);
    QString::~QString((QString *)&selectionEnd);
    MVar3 = QTextCursor::selectionEnd();
    QTextCursor::setPosition((int)&selectedText + 0x10,MVar3);
    QTextCursor::insertText((QString *)&selectedText.d.size);
    iVar2 = QTextCursor::position();
    QTextCursor::setPosition((int)&selectedText + 0x10,iVar2 - local_44);
  }
  else {
    MVar3 = QTextCursor::selectionEnd();
    QTextCursor::setPosition((int)&selectedText + 0x10,MVar3);
    MVar3 = QTextCursor::position();
    QTextCursor::insertText((QString *)&selectedText.d.size);
    MVar4 = QTextCursor::position();
    QTextCursor::setPosition((int)&selectedText + 0x10,MVar3);
    QTextCursor::setPosition((int)&selectedText + 0x10,MVar4);
  }
  QPlainTextEdit::setTextCursor((QTextCursor *)this);
  QString::~QString((QString *)local_30);
  QTextCursor::~QTextCursor((QTextCursor *)&selectedText.d.size);
  return;
}

Assistant:

void QMarkdownTextEdit::duplicateText() {
    QTextCursor cursor = this->textCursor();
    QString selectedText = cursor.selectedText();

    // duplicate line if no text was selected
    if (selectedText.isEmpty()) {
        const int position = cursor.position();

        // select the whole line
        cursor.movePosition(QTextCursor::StartOfBlock);
        cursor.movePosition(QTextCursor::EndOfBlock, QTextCursor::KeepAnchor);

        const int positionDiff = cursor.position() - position;
        selectedText = "\n" + cursor.selectedText();

        // insert text with new line at end of the selected line
        cursor.setPosition(cursor.selectionEnd());
        cursor.insertText(selectedText);

        // set the position to same position it was in the duplicated line
        cursor.setPosition(cursor.position() - positionDiff);
    } else {
        // duplicate selected text
        cursor.setPosition(cursor.selectionEnd());
        const int selectionStart = cursor.position();

        // insert selected text
        cursor.insertText(selectedText);
        const int selectionEnd = cursor.position();

        // select the inserted text
        cursor.setPosition(selectionStart);
        cursor.setPosition(selectionEnd, QTextCursor::KeepAnchor);
    }

    this->setTextCursor(cursor);
}